

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QSettingsIniKey>::reserve(QList<QSettingsIniKey> *this,qsizetype asize)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QGenericArrayOps<QSettingsIniKey> *this_00;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QSettingsIniKey> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffff5c;
  QSettingsIniKey *in_stack_ffffffffffffff60;
  QArrayDataPointer<QSettingsIniKey> *in_stack_ffffffffffffff68;
  QSettingsIniKey *b;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QSettingsIniKey> *in_stack_ffffffffffffff80;
  qsizetype local_40;
  QSettingsIniKey local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = capacity((QList<QSettingsIniKey> *)0x7ba3d5);
  qVar3 = QArrayDataPointer<QSettingsIniKey>::freeSpaceAtBegin(in_stack_ffffffffffffff68);
  if (in_RSI <= qVar2 - qVar3) {
    QArrayDataPointer<QSettingsIniKey>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QSettingsIniKey>::flags
                   ((QArrayDataPointer<QSettingsIniKey> *)in_stack_ffffffffffffff60);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c.i);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_007ba5b1;
    QArrayDataPointer<QSettingsIniKey>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QSettingsIniKey>::isShared
                      ((QArrayDataPointer<QSettingsIniKey> *)in_stack_ffffffffffffff60);
    if (!bVar1) {
      QArrayDataPointer<QSettingsIniKey>::operator->(in_RDI);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c.i);
      QArrayDataPointer<QSettingsIniKey>::setFlag
                ((QArrayDataPointer<QSettingsIniKey> *)0x7ba48f,
                 (ArrayOptions)in_stack_ffffffffffffff5c.i);
      goto LAB_007ba5b1;
    }
  }
  local_38.super_QString.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.super_QString.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.super_QString.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QSettingsIniKey> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  b = &local_38;
  QArrayDataPointer<QSettingsIniKey>::QArrayDataPointer
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (AllocationOption)((ulong)b >> 0x20));
  this_00 = (QGenericArrayOps<QSettingsIniKey> *)
            QArrayDataPointer<QSettingsIniKey>::operator->((QArrayDataPointer<QSettingsIniKey> *)b);
  QArrayDataPointer<QSettingsIniKey>::operator->(in_RDI);
  QArrayDataPointer<QSettingsIniKey>::begin((QArrayDataPointer<QSettingsIniKey> *)0x7ba511);
  QArrayDataPointer<QSettingsIniKey>::operator->(in_RDI);
  QArrayDataPointer<QSettingsIniKey>::end
            ((QArrayDataPointer<QSettingsIniKey> *)in_stack_ffffffffffffff60);
  QtPrivate::QGenericArrayOps<QSettingsIniKey>::copyAppend(this_00,b,in_stack_ffffffffffffff60);
  pDVar4 = QArrayDataPointer<QSettingsIniKey>::d_ptr
                     ((QArrayDataPointer<QSettingsIniKey> *)&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff60 =
         (QSettingsIniKey *)
         QArrayDataPointer<QSettingsIniKey>::operator->
                   ((QArrayDataPointer<QSettingsIniKey> *)&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c.i);
    QArrayDataPointer<QSettingsIniKey>::setFlag
              ((QArrayDataPointer<QSettingsIniKey> *)0x7ba578,
               (ArrayOptions)in_stack_ffffffffffffff5c.i);
  }
  QArrayDataPointer<QSettingsIniKey>::swap
            ((QArrayDataPointer<QSettingsIniKey> *)in_stack_ffffffffffffff60,
             (QArrayDataPointer<QSettingsIniKey> *)
             CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
  QArrayDataPointer<QSettingsIniKey>::~QArrayDataPointer
            ((QArrayDataPointer<QSettingsIniKey> *)in_stack_ffffffffffffff60);
LAB_007ba5b1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}